

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::VariableP<int>::VariableP(VariableP<int> *this,Variable<int> *ptr)

{
  Variable<int> *ptr_local;
  VariableP<int> *this_local;
  
  de::SharedPtr<const_vkt::shaderexecutor::Variable<int>_>::SharedPtr
            (&this->super_SharedPtr<const_vkt::shaderexecutor::Variable<int>_>,ptr);
  return;
}

Assistant:

explicit	VariableP	(const Variable<T>* ptr) : Super(ptr) {}